

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmState *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  _Alloc_hider __p;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  cmValue cVar7;
  Status SVar8;
  cmValue cVar9;
  string fullName;
  undefined1 local_b0 [56];
  string message;
  pointer local_58;
  _Alloc_hider local_50;
  string redirectsDir;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::operator+(&fullName,psVar6,"/CMakeFiles/CMakeScratch");
  cmsys::SystemTools::RemoveADirectory(&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  iVar5 = DoPreConfigureChecks(this);
  if (iVar5 < 0) {
    return -2;
  }
  if (iVar5 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_HOME_DIRECTORY",(allocator<char> *)local_b0);
    cVar7.Value = GetHomeDirectory_abi_cxx11_(this);
    AddCacheEntry(this,&fullName,cVar7,
                  "Source directory with the top level CMakeLists.txt file for this project",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  fullName._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
  fullName._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
  local_b0._0_8_ = &DAT_00000018;
  local_b0._8_8_ = "/CMakeFiles/pkgRedirects";
  cmStrCat<>(&redirectsDir,(cmAlphaNum *)&fullName,(cmAlphaNum *)local_b0);
  cmsys::SystemTools::RemoveADirectory(&redirectsDir);
  SVar8 = cmsys::SystemTools::MakeDirectory(&redirectsDir,(mode_t *)0x0);
  if (SVar8.Kind_ != Success) {
    std::operator+(&fullName,"Unable to (re)create the private pkgRedirects directory:\n",
                   &redirectsDir);
    cmSystemTools::Error(&fullName);
LAB_002a3a02:
    std::__cxx11::string::~string((string *)&fullName);
    iVar5 = -1;
    goto LAB_002a40dd;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR",(allocator<char> *)local_b0);
  AddCacheEntry(this,&fullName,&redirectsDir,"Value Computed by CMake.",5);
  std::__cxx11::string::~string((string *)&fullName);
  if ((this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)local_b0);
    cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)local_b0);
    cVar9 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value != (string *)0x0) {
      if (cVar9.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,"",(allocator<char> *)(local_b0 + 0x37));
      }
      else {
        std::__cxx11::string::string((string *)local_b0,(string *)cVar9.Value);
      }
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                (&fullName,cVar7.Value,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      CreateGlobalGenerator((cmake *)local_b0,(string *)this,SUB81(&fullName,0));
      uVar3 = local_b0._0_8_;
      local_b0._0_8_ = (cmake *)0x0;
      pcVar2 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)uVar3;
      if ((pcVar2 != (cmGlobalGenerator *)0x0) &&
         ((*pcVar2->_vptr_cmGlobalGenerator[1])(), (cmake *)local_b0._0_8_ != (cmake *)0x0)) {
        (**(code **)(*(long *)local_b0._0_8_ + 8))();
      }
      std::__cxx11::string::~string((string *)&fullName);
    }
    pcVar2 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    if (pcVar2 == (cmGlobalGenerator *)0x0) {
      CreateDefaultGlobalGenerator(this);
      if ((this->GlobalGenerator)._M_t.
          super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
          super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0
         ) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fullName,"Could not create generator",(allocator<char> *)local_b0);
        cmSystemTools::Error(&fullName);
        goto LAB_002a3a02;
      }
    }
    else {
      cmSystemTools::s_ForceUnixPaths = pcVar2->ForceUnixPaths;
    }
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)local_b0);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if ((cVar7.Value != (string *)0x0) &&
     (pcVar2 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
     iVar5 = (*pcVar2->_vptr_cmGlobalGenerator[4])(pcVar2,cVar7.Value), (char)iVar5 == '\0')) {
    fullName._M_dataplus._M_p = &DAT_00000013;
    fullName._M_string_length = (size_type)anon_var_dwarf_a7da75;
    (*((this->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[3])
              (&local_58);
    local_b0._0_8_ = local_50._M_p;
    local_b0._8_8_ = local_58;
    cmStrCat<char[48],std::__cxx11::string,char[104]>
              (&message,(cmAlphaNum *)&fullName,(cmAlphaNum *)local_b0,
               (char (*) [48])"\nDoes not match the generator used previously: ",cVar7.Value,
               (char (*) [104])
               "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
              );
    std::__cxx11::string::~string((string *)&local_58);
    cmSystemTools::Error(&message);
LAB_002a40d0:
    std::__cxx11::string::~string((string *)&message);
    iVar5 = -2;
    goto LAB_002a40dd;
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)local_b0);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)&message);
    (*((this->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[3])
              (local_b0);
    AddCacheEntry(this,&fullName,(string *)local_b0,"Name of generator.",4);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&fullName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)&message);
    cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
              ((string *)local_b0,
               (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
    AddCacheEntry(this,&fullName,(string *)local_b0,"Name of external makefile project generator.",4
                 );
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&fullName);
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_TOOLCHAIN_FILE",(allocator<char> *)local_b0);
    cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value == (string *)0x0) {
      fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
      fullName._M_string_length = 0;
      fullName.field_2._M_local_buf[0] = '\0';
      bVar4 = cmsys::SystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE",&fullName);
      if (bVar4 && fullName._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,"CMAKE_TOOLCHAIN_FILE",(allocator<char> *)&message);
        AddCacheEntry(this,(string *)local_b0,&fullName,"The CMake toolchain file",2);
        std::__cxx11::string::~string((string *)local_b0);
      }
      std::__cxx11::string::~string((string *)&fullName);
    }
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)local_b0);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)local_b0);
    AddCacheEntry(this,&fullName,(cmValue)&this->GeneratorInstance,"Generator instance identifier.",
                  4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if ((this->GeneratorInstanceSet == true) &&
          (bVar4 = std::operator!=(&this->GeneratorInstance,cVar7.Value), bVar4)) {
    fullName._M_dataplus._M_p = &DAT_0000001b;
    fullName._M_string_length = (size_type)anon_var_dwarf_a7dadf;
    local_b0._8_8_ = (this->GeneratorInstance)._M_dataplus._M_p;
    local_b0._0_8_ = (this->GeneratorInstance)._M_string_length;
    cmStrCat<char[47],std::__cxx11::string,char[104]>
              (&message,(cmAlphaNum *)&fullName,(cmAlphaNum *)local_b0,
               (char (*) [47])"\nDoes not match the instance used previously: ",cVar7.Value,
               (char (*) [104])
               "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
              );
    cmSystemTools::Error(&message);
    goto LAB_002a40d0;
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)local_b0);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)local_b0);
    AddCacheEntry(this,&fullName,(cmValue)&this->GeneratorPlatform,"Name of generator platform.",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if ((this->GeneratorPlatformSet == true) &&
          (bVar4 = std::operator!=(&this->GeneratorPlatform,cVar7.Value), bVar4)) {
    fullName._M_dataplus._M_p = &DAT_0000001b;
    fullName._M_string_length = (size_type)anon_var_dwarf_a7db14;
    local_b0._8_8_ = (this->GeneratorPlatform)._M_dataplus._M_p;
    local_b0._0_8_ = (this->GeneratorPlatform)._M_string_length;
    cmStrCat<char[47],std::__cxx11::string,char[104]>
              (&message,(cmAlphaNum *)&fullName,(cmAlphaNum *)local_b0,
               (char (*) [47])"\nDoes not match the platform used previously: ",cVar7.Value,
               (char (*) [104])
               "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
              );
    cmSystemTools::Error(&message);
    goto LAB_002a40d0;
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)local_b0);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)local_b0);
    AddCacheEntry(this,&fullName,(cmValue)&this->GeneratorToolset,"Name of generator toolset.",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if ((this->GeneratorToolsetSet == true) &&
          (bVar4 = std::operator!=(&this->GeneratorToolset,cVar7.Value), bVar4)) {
    fullName._M_dataplus._M_p = &DAT_0000001a;
    fullName._M_string_length = (size_type)anon_var_dwarf_a7db3b;
    local_b0._8_8_ = (this->GeneratorToolset)._M_dataplus._M_p;
    local_b0._0_8_ = (this->GeneratorToolset)._M_string_length;
    cmStrCat<char[46],std::__cxx11::string,char[104]>
              (&message,(cmAlphaNum *)&fullName,(cmAlphaNum *)local_b0,
               (char (*) [46])"\nDoes not match the toolset used previously: ",cVar7.Value,
               (char (*) [104])
               "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
              );
    cmSystemTools::Error(&message);
    goto LAB_002a40d0;
  }
  bVar4 = GetIsInTryCompile(this);
  if (!bVar4) {
    cmGlobalGenerator::ClearEnabledLanguages
              ((this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
    TruncateOutputLog(this,"CMakeOutput.log");
    TruncateOutputLog(this,"CMakeError.log");
  }
  local_b0._0_8_ = this;
  std::make_unique<cmFileAPI,cmake*>((cmake **)&fullName);
  __p = fullName._M_dataplus;
  fullName._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>::reset
            ((__uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_> *)&this->FileAPI,
             (pointer)__p._M_p);
  std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr
            ((unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> *)&fullName);
  cmFileAPI::ReadQueries
            ((this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>.
             _M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
             super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
  (*((this->GlobalGenerator)._M_t.
     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
     super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[0xc])
            ();
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)local_b0);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value != (string *)0x0) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator<char> *)local_b0);
    cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator<char> *)local_b0);
      AddCacheEntry(this,&fullName,"","Single output directory for building all libraries.",1);
      std::__cxx11::string::~string((string *)&fullName);
    }
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)local_b0);
    cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)local_b0);
      AddCacheEntry(this,&fullName,"","Single output directory for building all executables.",1);
      std::__cxx11::string::~string((string *)&fullName);
    }
  }
  this_00 = (cmMakefile *)
            **(undefined8 **)
              &(((this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->Makefiles).
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CTEST_USE_LAUNCHERS",(allocator<char> *)&message);
  bVar4 = cmMakefile::IsOn(this_00,&fullName);
  if (bVar4) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"RULE_LAUNCH_COMPILE",(allocator<char> *)&local_58);
    cVar7 = cmState::GetGlobalProperty(pcVar1,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,
                 "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                 ,(allocator<char> *)local_b0);
      cmSystemTools::Error(&fullName);
      goto LAB_002a4390;
    }
  }
  else {
LAB_002a4390:
    std::__cxx11::string::~string((string *)&fullName);
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  cmState::SaveVerificationScript
            (pcVar1,psVar6,
             (this->Messenger)._M_t.
             super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
             super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
             super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl);
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  SaveCache(this,psVar6);
  bVar4 = cmSystemTools::GetErrorOccurredFlag();
  iVar5 = -(uint)bVar4;
LAB_002a40dd:
  std::__cxx11::string::~string((string *)&redirectsDir);
  return iVar5;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  cmSystemTools::RemoveADirectory(this->GetHomeOutputDirectory() +
                                  "/CMakeFiles/CMakeScratch");

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // We want to create the package redirects directory as early as possible,
  // but not before pre-configure checks have passed. This ensures we get
  // errors about inappropriate source/binary directories first.
  const auto redirectsDir =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles/pkgRedirects");
  cmSystemTools::RemoveADirectory(redirectsDir);
  if (!cmSystemTools::MakeDirectory(redirectsDir)) {
    cmSystemTools::Error(
      "Unable to (re)create the private pkgRedirects directory:\n" +
      redirectsDir);
    return -1;
  }
  this->AddCacheEntry("CMAKE_FIND_PACKAGE_REDIRECTS_DIR", redirectsDir,
                      "Value Computed by CMake.", cmStateEnums::STATIC);

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    cmValue extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message =
        cmStrCat("Error: generator : ", this->GlobalGenerator->GetName(),
                 "\nDoes not match the generator used previously: ", *genName,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR", this->GlobalGenerator->GetName(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry(
      "CMAKE_EXTRA_GENERATOR", this->GlobalGenerator->GetExtraGeneratorName(),
      "Name of external makefile project generator.", cmStateEnums::INTERNAL);

    if (!this->State->GetInitializedCacheValue("CMAKE_TOOLCHAIN_FILE")) {
      std::string envToolchain;
      if (cmSystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE", envToolchain) &&
          !envToolchain.empty()) {
        this->AddCacheEntry("CMAKE_TOOLCHAIN_FILE", envToolchain,
                            "The CMake toolchain file",
                            cmStateEnums::FILEPATH);
      }
    }
  }

  if (cmValue instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message =
        cmStrCat("Error: generator instance: ", this->GeneratorInstance,
                 "\nDoes not match the instance used previously: ", *instance,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance,
                        "Generator instance identifier.",
                        cmStateEnums::INTERNAL);
  }

  if (cmValue platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = cmStrCat(
        "Error: generator platform: ", this->GeneratorPlatform,
        "\nDoes not match the platform used previously: ", *platformName,
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform,
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (cmValue tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message =
        cmStrCat("Error: generator toolset: ", this->GeneratorToolset,
                 "\nDoes not match the toolset used previously: ", *tsName,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset,
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

#if !defined(CMAKE_BOOTSTRAP)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  const auto& mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory(),
                                      this->Messenger.get());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  return 0;
}